

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O3

QSize __thiscall QTabWidget::sizeHint(QTabWidget *this)

{
  QTabWidgetPrivate *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  QWidget *pQVar7;
  undefined8 uVar8;
  QStyle *pQVar9;
  QSize QVar10;
  int iVar11;
  int iVar12;
  QTabWidget *that;
  int iVar13;
  int iVar14;
  long in_FS_OFFSET;
  undefined1 auVar15 [16];
  QStyleOptionTabWidgetFrame opt;
  int local_e0;
  undefined8 local_c8;
  QStyleOptionTabWidgetFrame local_c0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabWidgetPrivate **)&(this->super_QWidget).field_0x8;
  memset(&local_c0,0xaa,0x88);
  QStyleOptionTabWidgetFrame::QStyleOptionTabWidgetFrame(&local_c0);
  (**(code **)(*(long *)&this->super_QWidget + 0x1b0))(this,&local_c0);
  local_c0.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)(QFlagsStorage<QStyle::StateFlag>)0x0;
  pQVar7 = this_00->leftCornerWidget;
  uVar6 = 0;
  uVar5 = 0;
  iVar11 = 0;
  if (pQVar7 != (QWidget *)0x0) {
    uVar5 = 0;
    iVar11 = 0;
    if ((pQVar7->data->widget_attributes & 0x8000) != 0) {
      uVar5 = (**(code **)(*(long *)pQVar7 + 0x70))();
      iVar11 = (int)((ulong)uVar5 >> 0x20);
    }
  }
  pQVar7 = this_00->rightCornerWidget;
  if (pQVar7 == (QWidget *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    if ((pQVar7->data->widget_attributes & 0x8000) != 0) {
      uVar6 = (**(code **)(*(long *)pQVar7 + 0x70))();
      iVar2 = (int)((ulong)uVar6 >> 0x20);
    }
  }
  if (this_00->dirty == false) {
    setUpLayout(this,true);
  }
  iVar3 = QStackedWidget::count(this_00->stack);
  iVar14 = -1;
  iVar12 = -1;
  if (0 < iVar3) {
    iVar3 = 0;
    do {
      pQVar7 = QStackedWidget::widget(this_00->stack,iVar3);
      iVar4 = iVar12;
      if ((pQVar7 != (QWidget *)0x0) && (bVar1 = QTabBar::isTabVisible(this_00->tabs,iVar3), bVar1))
      {
        uVar8 = (**(code **)(*(long *)pQVar7 + 0x70))(pQVar7);
        if (iVar14 <= (int)uVar8) {
          iVar14 = (int)uVar8;
        }
        iVar4 = (int)((ulong)uVar8 >> 0x20);
        if (iVar4 < iVar12) {
          iVar4 = iVar12;
        }
      }
      iVar12 = iVar4;
      iVar3 = iVar3 + 1;
      iVar4 = QStackedWidget::count(this_00->stack);
    } while (iVar3 < iVar4);
  }
  bVar1 = QTabWidgetPrivate::isAutoHidden(this_00);
  iVar3 = -1;
  iVar4 = -1;
  if (!bVar1) {
    uVar8 = (**(code **)(*(long *)&this_00->tabs->super_QWidget + 0x70))();
    bVar1 = QTabBar::usesScrollButtons
                      (*(QTabBar **)(*(long *)&(this->super_QWidget).field_0x8 + 600));
    if (bVar1) {
      iVar4 = 200;
      iVar3 = 200;
    }
    else {
      QGuiApplication::primaryScreen();
      auVar15 = QScreen::virtualGeometry();
      iVar3 = (auVar15._8_4_ - auVar15._0_4_) + 1;
      iVar4 = (auVar15._12_4_ - auVar15._4_4_) + 1;
    }
    if ((int)uVar8 < iVar3) {
      iVar3 = (int)uVar8;
    }
    iVar13 = (int)((ulong)uVar8 >> 0x20);
    if (iVar13 < iVar4) {
      iVar4 = iVar13;
    }
  }
  iVar13 = (int)uVar6;
  local_e0 = (int)uVar5;
  if (this_00->pos < West) {
    iVar3 = iVar13 + local_e0 + iVar3;
    if (iVar3 <= iVar14) {
      iVar3 = iVar14;
    }
    if (iVar4 < iVar11) {
      iVar4 = iVar11;
    }
    if (iVar4 <= iVar2) {
      iVar4 = iVar2;
    }
    iVar4 = iVar4 + iVar12;
  }
  else {
    if (iVar3 < local_e0) {
      iVar3 = local_e0;
    }
    if (iVar3 <= iVar13) {
      iVar3 = iVar13;
    }
    iVar3 = iVar3 + iVar14;
    iVar4 = iVar2 + iVar11 + iVar4;
    if (iVar4 <= iVar12) {
      iVar4 = iVar12;
    }
  }
  local_c8 = CONCAT44(iVar4,iVar3);
  pQVar9 = QWidget::style(&this->super_QWidget);
  QVar10 = (QSize)(**(code **)(*(long *)pQVar9 + 0xe8))(pQVar9,0x11,&local_c0,&local_c8,this);
  QStyleOption::~QStyleOption(&local_c0.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return QVar10;
}

Assistant:

QSize QTabWidget::sizeHint() const
{
    Q_D(const QTabWidget);
    QSize lc(0, 0), rc(0, 0);
    QStyleOptionTabWidgetFrame opt;
    initStyleOption(&opt);
    opt.state = QStyle::State_None;

    if (d->leftCornerWidget && d->leftCornerWidget->isVisible())
        lc = d->leftCornerWidget->sizeHint();
    if (d->rightCornerWidget  && d->rightCornerWidget->isVisible())
        rc = d->rightCornerWidget->sizeHint();
    if (!d->dirty) {
        QTabWidget *that = const_cast<QTabWidget*>(this);
        that->setUpLayout(true);
    }
    QSize s;
    for (int i=0; i< d->stack->count(); ++i) {
        if (const QWidget* w = d->stack->widget(i)) {
            if (d->tabs->isTabVisible(i))
                s = s.expandedTo(w->sizeHint());
        }
    }
    QSize t;
    if (!d->isAutoHidden()) {
        t = d->tabs->sizeHint();
        if (usesScrollButtons())
            t = t.boundedTo(QSize(200,200));
        else
            t = t.boundedTo(QGuiApplication::primaryScreen()->virtualGeometry().size());
    }

    QSize sz = basicSize(d->pos == North || d->pos == South, lc, rc, s, t);

    return style()->sizeFromContents(QStyle::CT_TabWidget, &opt, sz, this);
}